

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSGetWorkSpace(void *arkode_mem,long *lenrw,long *leniw)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  int retval;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  long *in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SUNLinearSolver in_stack_ffffffffffffffb8;
  SUNMatrix in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  long local_30;
  int local_4;
  
  local_4 = arkLs_AccessLMem((void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             (char *)in_stack_ffffffffffffffc0,
                             (ARKodeMem *)in_stack_ffffffffffffffb8,
                             (ARKLsMem *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (local_4 == 0) {
    *in_RSI = 3;
    *in_RDX = 0x1e;
    if (*(long *)(*(long *)(*(long *)(local_30 + 0x58) + 8) + 0x20) != 0) {
      N_VSpace((N_Vector)(ulong)in_stack_ffffffffffffffb0,(sunindextype *)in_stack_ffffffffffffffa8,
               (sunindextype *)0xeb373a);
      *in_RSI = (long)(in_stack_ffffffffffffffcc << 1) + *in_RSI;
      *in_RDX = (long)(in_stack_ffffffffffffffc8 << 1) + *in_RDX;
    }
    if (((*(long *)(local_30 + 0x48) != 0) &&
        (*(long *)(*(long *)(*(long *)(local_30 + 0x48) + 8) + 0x48) != 0)) &&
       (local_4 = SUNMatSpace(in_stack_ffffffffffffffc0,(long *)in_stack_ffffffffffffffb8,
                              (long *)CONCAT44(local_4,in_stack_ffffffffffffffb0)), local_4 == 0)) {
      *in_RSI = (long)&in_stack_ffffffffffffffc0->content + *in_RSI;
      *in_RDX = (long)&in_stack_ffffffffffffffb8->content + *in_RDX;
    }
    if ((*(long *)(*(long *)(*(long *)(local_30 + 0x38) + 8) + 0x60) != 0) &&
       (iVar1 = SUNLinSolSpace(in_stack_ffffffffffffffb8,
                               (long *)CONCAT44(local_4,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffa8), iVar1 == 0)) {
      *in_RSI = (long)&in_stack_ffffffffffffffc0->content + *in_RSI;
      *in_RDX = (long)&in_stack_ffffffffffffffb8->content + *in_RDX;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSGetWorkSpace(void *arkode_mem, long int *lenrw,
                      long int *leniw)
{
  ARKodeMem    ark_mem;
  ARKLsMem     arkls_mem;
  sunindextype lrw1, liw1;
  long int     lrw, liw;
  int          retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSGetWorkSpace",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* start with fixed sizes plus vector/matrix pointers */
  *lenrw = 3;
  *leniw = 30;

  /* add NVector sizes */
  if (arkls_mem->x->ops->nvspace) {
    N_VSpace(arkls_mem->x, &lrw1, &liw1);
    *lenrw += 2*lrw1;
    *leniw += 2*liw1;
  }

  /* add SUNMatrix size (only account for the one owned by Ls interface) */
  if (arkls_mem->savedJ)
    if (arkls_mem->savedJ->ops->space) {
      retval = SUNMatSpace(arkls_mem->savedJ, &lrw, &liw);
      if (retval == 0) {
        *lenrw += lrw;
        *leniw += liw;
      }
    }

  /* add LS sizes */
  if (arkls_mem->LS->ops->space) {
    retval = SUNLinSolSpace(arkls_mem->LS, &lrw, &liw);
    if (retval == SUNLS_SUCCESS) {
      *lenrw += lrw;
      *leniw += liw;
    }
  }

  return(ARKLS_SUCCESS);
}